

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::SharedBasicVarCase::SharedBasicVarCase
          (SharedBasicVarCase *this,Context *context,char *name,DataType basicType,
          Precision precision,UVec3 *workGroupSize)

{
  int i;
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  undefined1 auStack_1d8 [8];
  char *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_1d0 = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (precision != PRECISION_LAST) {
    pcVar1 = glu::getPrecisionName(precision);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  }
  pcVar1 = glu::getDataTypeName(basicType);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,", work group size = ",0x14);
  tcu::operator<<((ostream *)local_1a8,workGroupSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,local_1d0,(char *)local_1c8);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0215f9c0;
  (this->super_TestCase).m_context = context;
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SharedBasicVarCase_0215f920;
  this->m_basicType = basicType;
  this->m_precision = precision;
  lVar3 = 0;
  do {
    (this->m_workGroupSize).m_data[lVar3] = workGroupSize->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

SharedBasicVarCase::SharedBasicVarCase (Context& context, const char* name, DataType basicType, Precision precision, const tcu::UVec3& workGroupSize)
	: TestCase			(context, name, getBasicCaseDescription(basicType, precision, workGroupSize).c_str())
	, m_basicType		(basicType)
	, m_precision		(precision)
	, m_workGroupSize	(workGroupSize)
	, m_program			(DE_NULL)
{
}